

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlNewSAXParserCtxt(void)

{
  int iVar1;
  int iVar2;
  void *val;
  htmlParserCtxtPtr val_00;
  uint local_34;
  int n_userData;
  void *userData;
  int n_sax;
  htmlSAXHandler *sax;
  htmlParserCtxtPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (userData._4_4_ = 0; (int)userData._4_4_ < 1; userData._4_4_ = userData._4_4_ + 1) {
    for (local_34 = 0; (int)local_34 < 3; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_userdata(local_34,1);
      val_00 = (htmlParserCtxtPtr)htmlNewSAXParserCtxt(0,val);
      desret_htmlParserCtxtPtr(val_00);
      call_tests = call_tests + 1;
      des_userdata(local_34,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)userData._4_4_);
        printf(" %d",(ulong)local_34);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlNewSAXParserCtxt(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlParserCtxtPtr ret_val;
    const htmlSAXHandler * sax; /* SAX handler */
    int n_sax;
    void * userData; /* user data */
    int n_userData;

    for (n_sax = 0;n_sax < gen_nb_const_htmlSAXHandler_ptr;n_sax++) {
    for (n_userData = 0;n_userData < gen_nb_userdata;n_userData++) {
        mem_base = xmlMemBlocks();
        sax = gen_const_htmlSAXHandler_ptr(n_sax, 0);
        userData = gen_userdata(n_userData, 1);

        ret_val = htmlNewSAXParserCtxt(sax, userData);
        desret_htmlParserCtxtPtr(ret_val);
        call_tests++;
        des_const_htmlSAXHandler_ptr(n_sax, sax, 0);
        des_userdata(n_userData, userData, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlNewSAXParserCtxt",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_sax);
            printf(" %d", n_userData);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}